

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

string * __thiscall
despot::SemiChainBelief::text_abi_cxx11_(string *__return_storage_ptr__,SemiChainBelief *this)

{
  pointer pvVar1;
  ostream *poVar2;
  int r;
  ulong uVar3;
  int a;
  ulong uVar4;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->alpha_).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->alpha_).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&oss,(int)uVar4);
    std::operator<<(poVar2," ->");
    for (uVar3 = 0;
        pvVar1 = (this->alpha_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)*(pointer *)
                               ((long)&pvVar1[uVar4].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + 8) -
                        *(long *)&pvVar1[uVar4].super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data >> 3); uVar3 = uVar3 + 1) {
      std::operator<<((ostream *)&oss," ");
      std::ostream::_M_insert<double>
                (*(double *)
                  (*(long *)&(this->alpha_).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data + uVar3 * 8));
    }
    std::endl<char,std::char_traits<char>>((ostream *)&oss);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

string SemiChainBelief::text() const {
	ostringstream oss;
	for (int a = 0; a < alpha_.size(); a++) {
		oss << a << " ->";
		for (int r = 0; r < alpha_[a].size(); r++)
			oss << " " << alpha_[a][r];
		oss << endl;
	}
	return oss.str();
}